

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_manager.hpp
# Opt level: O2

vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
* __thiscall
ylt::metric::manager_helper::
filter_metrics_by_name<std::vector<std::shared_ptr<ylt::metric::metric_t>,std::allocator<std::shared_ptr<ylt::metric::metric_t>>>>
          (vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
           *__return_storage_ptr__,manager_helper *this,
          vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
          *metrics,regex *name_regex)

{
  value_type *pvVar1;
  bool bVar2;
  shared_ptr<ylt::metric::metric_t> *m;
  value_type *__x;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pvVar1 = *(value_type **)(this + 8);
  for (__x = *(value_type **)this; __x != pvVar1; __x = __x + 1) {
    bVar2 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      (&((__x->super___shared_ptr<ylt::metric::metric_t,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr)->name_,
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)metrics,0);
    if (bVar2) {
      std::
      vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
      ::push_back(__return_storage_ptr__,__x);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::shared_ptr<metric_t>> filter_metrics_by_name(
      auto& metrics, const std::regex& name_regex) {
    std::vector<std::shared_ptr<metric_t>> filtered_metrics;
    for (auto& m : metrics) {
      if (std::regex_match(m->str_name(), name_regex)) {
        filtered_metrics.push_back(m);
      }
    }
    return filtered_metrics;
  }